

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  sqlite3_xauth p_Var1;
  Select *p;
  uint uVar2;
  int iVar3;
  int iVar4;
  RenameToken *pToken_2;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  i64 iVar8;
  char *pcVar9;
  i64 iVar10;
  Table *pTVar11;
  Table *pTVar12;
  RenameToken **ppRVar13;
  RenameToken *pRVar14;
  RenameToken *pRVar15;
  RenameToken *pToken;
  RenameToken **ppRVar16;
  uint uVar17;
  FKey *pFVar18;
  Index *pIVar19;
  TriggerStep *pTVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  RenameCtx sCtx;
  Walker sWalker;
  Parse sParse;
  int local_27c;
  RenameToken *local_250;
  RenameCtx local_248;
  sqlite3_context *local_228;
  char *local_220;
  Walker local_218;
  sqlite3_value **local_1e8;
  sqlite3_xauth local_1e0;
  char *local_1d8;
  i64 local_1d0;
  Parse local_1c8;
  
  db = context->pOut->db;
  local_228 = context;
  pcVar5 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar6 = (char *)sqlite3ValueText(argv[3],'\x01');
  pcVar7 = (char *)sqlite3ValueText(argv[4],'\x01');
  iVar8 = sqlite3VdbeIntValue(argv[5]);
  pcVar9 = (char *)sqlite3ValueText(argv[6],'\x01');
  local_1d0 = sqlite3VdbeIntValue(argv[7]);
  iVar10 = sqlite3VdbeIntValue(argv[8]);
  uVar17 = (uint)iVar8;
  if (((int)uVar17 < 0 || pcVar9 == (char *)0x0) || (pcVar7 == (char *)0x0 || pcVar5 == (char *)0x0)
     ) {
    return;
  }
  p_Var1 = db->xAuth;
  local_220 = pcVar5;
  local_1d8 = pcVar9;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pTVar11 = sqlite3FindTable(db,pcVar7,pcVar6);
  if ((pTVar11 == (Table *)0x0) || ((int)pTVar11->nCol <= (int)uVar17)) goto LAB_001917fd;
  pcVar5 = pTVar11->aCol[uVar17 & 0x7fffffff].zName;
  local_248.pTab = (Table *)0x0;
  local_248.zOld = (char *)0x0;
  local_248.pList = (RenameToken *)0x0;
  uVar2 = 0xffffffff;
  if (uVar17 != (int)pTVar11->iPKey) {
    uVar2 = uVar17;
  }
  local_248._8_8_ = (ulong)uVar2 << 0x20;
  db->xAuth = (sqlite3_xauth)0x0;
  local_1e8 = argv;
  local_1e0 = p_Var1;
  iVar3 = renameParseSql(&local_1c8,pcVar6,0,db,local_220,(int)iVar10);
  pTVar12 = local_1c8.pNewTable;
  local_218.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_218.walkerDepth = 0;
  local_218.eCode = '\0';
  local_218._37_3_ = 0;
  local_218.xExprCallback = renameColumnExprCb;
  local_218.xSelectCallback = renameColumnSelectCb;
  local_248.pTab = pTVar11;
  local_218.pParse = &local_1c8;
  local_218.u.pNC = (NameContext *)&local_248;
  if (iVar3 == 0) {
    if (local_1c8.pNewTable == (Table *)0x0) {
      if (local_1c8.pNewIndex == (Index *)0x0) {
        pcVar7 = (char *)0x0;
        if ((int)iVar10 == 0) {
          pcVar7 = pcVar6;
        }
        iVar3 = renameResolveTrigger(&local_1c8,pcVar7);
        if (iVar3 != 0) goto LAB_0019177f;
        pTVar20 = (local_1c8.pNewTrigger)->step_list;
        if (pTVar20 != (TriggerStep *)0x0) {
          do {
            if ((pTVar20->zTarget != (char *)0x0) &&
               (pTVar12 = sqlite3LocateTable(&local_1c8,0,pTVar20->zTarget,pcVar6),
               pTVar12 == pTVar11)) {
              if (pTVar20->pUpsert != (Upsert *)0x0) {
                renameColumnElistNames(&local_1c8,&local_248,pTVar20->pUpsert->pUpsertSet,pcVar5);
              }
              renameColumnIdlistNames(&local_1c8,&local_248,pTVar20->pIdList,pcVar5);
              renameColumnElistNames(&local_1c8,&local_248,pTVar20->pExprList,pcVar5);
            }
            pTVar20 = pTVar20->pNext;
          } while (pTVar20 != (TriggerStep *)0x0);
        }
        if (local_1c8.pTriggerTab == pTVar11) {
          renameColumnIdlistNames(&local_1c8,&local_248,(local_1c8.pNewTrigger)->pColumns,pcVar5);
        }
        renameWalkTrigger(&local_218,local_1c8.pNewTrigger);
      }
      else {
        sqlite3WalkExprList(&local_218,(local_1c8.pNewIndex)->aColExpr);
        if ((local_1c8.pNewIndex)->pPartIdxWhere != (Expr *)0x0) {
          walkExpr(&local_218,(local_1c8.pNewIndex)->pPartIdxWhere);
        }
      }
    }
    else {
      p = (local_1c8.pNewTable)->pSelect;
      if (p == (Select *)0x0) {
        if ((local_1c8.pNewTable)->zName == (char *)0x0) {
          bVar22 = false;
        }
        else {
          iVar3 = sqlite3StrICmp(pcVar7,(local_1c8.pNewTable)->zName);
          bVar22 = iVar3 == 0;
        }
        local_248.pTab = pTVar12;
        if (bVar22) {
          ppRVar13 = &local_1c8.pRename;
          if (local_1c8.pRename != (RenameToken *)0x0) {
            pcVar6 = pTVar12->aCol[uVar17 & 0x7fffffff].zName;
            pRVar15 = local_1c8.pRename;
            ppRVar16 = ppRVar13;
            if ((char *)(local_1c8.pRename)->p != pcVar6) {
              do {
                pRVar14 = pRVar15;
                pRVar15 = pRVar14->pNext;
                if (pRVar15 == (RenameToken *)0x0) goto LAB_00191510;
              } while ((char *)pRVar15->p != pcVar6);
              ppRVar16 = &pRVar14->pNext;
            }
            *ppRVar16 = pRVar15->pNext;
            pRVar15->pNext = local_248.pList;
            local_248.nList = local_248.nList + 1;
            local_248.pList = pRVar15;
          }
LAB_00191510:
          if (((long)local_248._8_8_ < 0) && (local_1c8.pRename != (RenameToken *)0x0)) {
            pRVar15 = local_1c8.pRename;
            if ((i16 *)(local_1c8.pRename)->p != &(local_1c8.pNewTable)->iPKey) {
              do {
                pRVar14 = pRVar15;
                pRVar15 = pRVar14->pNext;
                if (pRVar15 == (RenameToken *)0x0) goto LAB_00191563;
              } while ((i16 *)pRVar15->p != &(local_1c8.pNewTable)->iPKey);
              ppRVar13 = &pRVar14->pNext;
            }
            *ppRVar13 = pRVar15->pNext;
            pRVar15->pNext = local_248.pList;
            local_248.nList = local_248.nList + 1;
            local_248.pList = pRVar15;
          }
LAB_00191563:
          sqlite3WalkExprList(&local_218,(local_1c8.pNewTable)->pCheck);
          pIVar19 = (local_1c8.pNewTable)->pIndex;
          if (pIVar19 != (Index *)0x0) {
            do {
              sqlite3WalkExprList(&local_218,pIVar19->aColExpr);
              pIVar19 = pIVar19->pNext;
            } while (pIVar19 != (Index *)0x0);
          }
        }
        pFVar18 = (local_1c8.pNewTable)->pFKey;
        bVar23 = true;
        if (pFVar18 != (FKey *)0x0) {
          local_27c = local_248.nList;
          local_250 = local_248.pList;
          do {
            iVar3 = pFVar18->nCol;
            if (0 < (long)iVar3) {
              lVar21 = 0;
              do {
                if ((bVar22) &&
                   (local_1c8.pRename != (RenameToken *)0x0 && pFVar18->aCol[lVar21].iFrom == uVar17
                   )) {
                  ppRVar13 = &local_1c8.pRename;
                  pRVar15 = local_1c8.pRename;
                  if ((sColMap *)(local_1c8.pRename)->p != pFVar18->aCol + lVar21) {
                    do {
                      pRVar14 = pRVar15;
                      pRVar15 = pRVar14->pNext;
                      if (pRVar15 == (RenameToken *)0x0) goto LAB_00191673;
                    } while ((sColMap *)pRVar15->p != pFVar18->aCol + lVar21);
                    ppRVar13 = &pRVar14->pNext;
                  }
                  *ppRVar13 = pRVar15->pNext;
                  pRVar15->pNext = local_250;
                  local_27c = local_27c + 1;
                  local_248.nList = local_27c;
                  local_250 = pRVar15;
                  local_248.pList = pRVar15;
                }
LAB_00191673:
                iVar4 = -(uint)(pcVar7 != (char *)0x0);
                if (pFVar18->zTo != (char *)0x0) {
                  iVar4 = sqlite3StrICmp(pFVar18->zTo,pcVar7);
                }
                if (iVar4 == 0) {
                  pcVar6 = pFVar18->aCol[lVar21].zCol;
                  bVar23 = pcVar6 != (char *)0x0 || pcVar5 != (char *)0x0;
                  if ((pcVar6 != (char *)0x0) && (pcVar5 != (char *)0x0)) {
                    iVar4 = sqlite3StrICmp(pcVar6,pcVar5);
                    bVar23 = iVar4 != 0;
                  }
                  if (!(bool)(local_1c8.pRename == (RenameToken *)0x0 | bVar23)) {
                    ppRVar13 = &local_1c8.pRename;
                    pRVar15 = local_1c8.pRename;
                    if ((char *)(local_1c8.pRename)->p != pcVar6) {
                      do {
                        pRVar14 = pRVar15;
                        pRVar15 = pRVar14->pNext;
                        if (pRVar15 == (RenameToken *)0x0) goto LAB_00191732;
                      } while ((char *)pRVar15->p != pcVar6);
                      ppRVar13 = &pRVar14->pNext;
                    }
                    *ppRVar13 = pRVar15->pNext;
                    pRVar15->pNext = local_250;
                    local_27c = local_27c + 1;
                    local_248.nList = local_27c;
                    local_250 = pRVar15;
                    local_248.pList = pRVar15;
                  }
                }
LAB_00191732:
                lVar21 = lVar21 + 1;
              } while (lVar21 != iVar3);
            }
            pFVar18 = pFVar18->pNextFrom;
          } while (pFVar18 != (FKey *)0x0);
          goto LAB_0019174b;
        }
        iVar3 = 0;
      }
      else {
        local_1c8.rc = 0;
        bVar23 = false;
        sqlite3SelectPrep(&local_1c8,p,(NameContext *)0x0);
        iVar3 = 7;
        if (db->mallocFailed == '\0') {
          iVar3 = local_1c8.rc;
        }
        if (iVar3 == 0) {
          sqlite3WalkSelect(&local_218,p);
LAB_0019174b:
          iVar3 = 0;
          bVar23 = true;
        }
      }
      if (!bVar23) goto LAB_0019177f;
    }
    iVar3 = renameEditSql(local_228,&local_248,local_220,local_1d8,(int)local_1d0);
  }
LAB_0019177f:
  p_Var1 = local_1e0;
  if (iVar3 != 0) {
    if (local_1c8.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(local_228,iVar3);
    }
    else {
      renameColumnParseError(local_228,0,local_1e8[1],local_1e8[2],&local_1c8);
    }
  }
  renameParseCleanup(&local_1c8);
  pRVar15 = local_248.pList;
  while (pRVar15 != (RenameToken *)0x0) {
    pRVar14 = pRVar15->pNext;
    sqlite3DbFreeNN(db,pRVar15);
    pRVar15 = pRVar14;
  }
  db->xAuth = p_Var1;
LAB_001917fd:
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, 0, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    Select *pSelect = sParse.pNewTable->pSelect;
    if( pSelect ){
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, sParse.pNewTable->pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else{
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      assert( sParse.pNewTable->pSelect==0 );
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        renameTokenFind(
            &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zName
        );
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
      }

      for(pFKey=sParse.pNewTable->pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse, (bTemp ? 0 : zDb));
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){ 
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( sParse.zErrMsg ){
      renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}